

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libj1939.c
# Opt level: O3

char * libj1939_addr2str(sockaddr_can *can)

{
  uint uVar1;
  uint uVar2;
  if_nameindex *piVar3;
  if_nameindex *piVar4;
  int iVar5;
  char *pcVar6;
  
  uVar1 = can->can_ifindex;
  if (uVar1 == 0) {
    pcVar6 = libj1939_addr2str::buf;
  }
  else {
    while( true ) {
      piVar4 = saved;
      if ((saved == (if_nameindex *)0x0) &&
         (saved = (if_nameindex *)if_nameindex(), saved == (if_nameindex *)0x0)) {
        err(1,"if_nameindex()");
      }
      uVar2 = saved->if_index;
      piVar3 = saved;
      while (uVar2 != 0) {
        if (uVar2 == uVar1) {
          if (piVar3->if_name == (char *)0x0) goto LAB_001037b6;
          iVar5 = sprintf(libj1939_addr2str::buf,"%s:");
          goto LAB_001037ce;
        }
        uVar2 = piVar3[1].if_index;
        piVar3 = piVar3 + 1;
      }
      if (piVar4 == (if_nameindex *)0x0) break;
      if_freenameindex((if_nameindex *)saved);
      saved = (if_nameindex *)0x0;
    }
LAB_001037b6:
    iVar5 = sprintf(libj1939_addr2str::buf,"#%i:",(ulong)(uint)can->can_ifindex);
LAB_001037ce:
    pcVar6 = libj1939_addr2str::buf + iVar5;
  }
  if ((can->can_addr).j1939.name == 0) {
    if ((can->can_addr).j1939.addr == 0xff) {
      pcVar6[0] = '-';
      pcVar6[1] = '\0';
      pcVar6 = pcVar6 + 1;
    }
    else {
      iVar5 = sprintf(pcVar6,"%02x");
      pcVar6 = pcVar6 + iVar5;
    }
  }
  else {
    iVar5 = sprintf(pcVar6,"%016llx");
    pcVar6 = pcVar6 + iVar5;
    if ((can->can_addr).j1939.pgn == 0xee00) {
      iVar5 = sprintf(pcVar6,".%02x",(ulong)(can->can_addr).j1939.addr);
      pcVar6 = pcVar6 + iVar5;
    }
  }
  if ((can->can_addr).j1939.pgn < 0x40000) {
    sprintf(pcVar6,",%05x");
  }
  return libj1939_addr2str::buf;
}

Assistant:

const char *libj1939_addr2str(const struct sockaddr_can *can)
{
	char *str;
	static char buf[128];

	str = buf;
	if (can->can_ifindex) {
		const char *ifname;
		ifname = libj1939_ifnam(can->can_ifindex);
		if (!ifname)
			str += sprintf(str, "#%i:", can->can_ifindex);
		else
			str += sprintf(str, "%s:", ifname);
	}
	if (can->can_addr.j1939.name) {
		str += sprintf(str, "%016llx", (unsigned long long)can->can_addr.j1939.name);
		if (can->can_addr.j1939.pgn == J1939_PGN_ADDRESS_CLAIMED)
			str += sprintf(str, ".%02x", can->can_addr.j1939.addr);
	} else if (can->can_addr.j1939.addr <= 0xfe)
		str += sprintf(str, "%02x", can->can_addr.j1939.addr);
	else
		str += sprintf(str, "-");
	if (can->can_addr.j1939.pgn <= J1939_PGN_MAX)
		str += sprintf(str, ",%05x", can->can_addr.j1939.pgn);

	return buf;
}